

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

bool __thiscall basisu::basisu_frontend::init_global_codebooks(basisu_frontend *this)

{
  byte bVar1;
  basisu_lowlevel_etc1s_transcoder *this_00;
  uint32_t uVar2;
  uint32_t uVar3;
  endpoint_vec *this_01;
  selector_vec *this_02;
  endpoint *peVar4;
  endpoint_cluster_etc_params *peVar5;
  etc_block *this_03;
  vector<basisu::vector<unsigned_int>_> *this_04;
  vector<basisu::vector<unsigned_int>_> *this_05;
  long in_RDI;
  uint32_t block_index_2;
  etc_block *blk;
  uint32_t selector_index;
  uint32_t endpoint_index;
  uint32_t block_index_1;
  uint32_t last_index_1;
  uint32_t first_index_1;
  uint32_t block_index_iter_1;
  uint32_t endpoint_cluster_index;
  uint32_t block_index;
  uint32_t last_index;
  uint32_t first_index;
  uint32_t block_index_iter;
  uint32_t N;
  uint32_t pass;
  uint32_t NUM_PASSES;
  uint32_t x;
  uint32_t y;
  uint32_t i_1;
  uint32_t i;
  selector_vec *selectors;
  endpoint_vec *endpoints;
  basisu_lowlevel_etc1s_transcoder *pTranscoder;
  undefined4 in_stack_fffffffffffffe58;
  uint32_t in_stack_fffffffffffffe5c;
  vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *in_stack_fffffffffffffe60;
  uint32_t in_stack_fffffffffffffe68;
  uint32_t in_stack_fffffffffffffe6c;
  function<void_()> *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe80;
  function<void_()> *in_stack_fffffffffffffe88;
  job_pool *in_stack_fffffffffffffe90;
  job_pool *in_stack_fffffffffffffea0;
  uint local_f4;
  uint uVar6;
  uint local_a0;
  uint local_90;
  uint local_40;
  uint local_38;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  this_00 = *(basisu_lowlevel_etc1s_transcoder **)(in_RDI + 0x28);
  this_01 = basist::basisu_lowlevel_etc1s_transcoder::get_endpoints(this_00);
  this_02 = basist::basisu_lowlevel_etc1s_transcoder::get_selectors(this_00);
  vector<basist::endpoint>::size(this_01);
  vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::resize
            ((vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *)
             in_stack_fffffffffffffe70,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
             ,SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
  local_24 = 0;
  while( true ) {
    uVar2 = vector<basist::endpoint>::size(this_01);
    if (uVar2 <= local_24) break;
    peVar4 = vector<basist::endpoint>::operator[]
                       ((vector<basist::endpoint> *)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    bVar1 = peVar4->m_inten5;
    peVar5 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                       (in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    peVar5->m_inten_table[0] = (uint)bVar1;
    peVar4 = vector<basist::endpoint>::operator[]
                       ((vector<basist::endpoint> *)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    bVar1 = peVar4->m_inten5;
    peVar5 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                       (in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    peVar5->m_inten_table[1] = (uint)bVar1;
    vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
              (in_stack_fffffffffffffe60,
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    vector<basist::endpoint>::operator[]
              ((vector<basist::endpoint> *)in_stack_fffffffffffffe60,
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    vector<basist::endpoint>::operator[]
              ((vector<basist::endpoint> *)in_stack_fffffffffffffe60,
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    vector<basist::endpoint>::operator[]
              ((vector<basist::endpoint> *)in_stack_fffffffffffffe60,
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    color_rgba::set((color_rgba *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                    in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                    (int)in_stack_fffffffffffffe60);
    peVar5 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                       (in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    peVar5->m_color_used[0] = true;
    peVar5 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                       (in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    peVar5->m_valid = true;
    local_24 = local_24 + 1;
  }
  vector<basist::selector>::size(this_02);
  vector<basisu::etc_block>::resize
            ((vector<basisu::etc_block> *)in_stack_fffffffffffffe70,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
  local_28 = 0;
  while( true ) {
    uVar3 = vector<basisu::etc_block>::size((vector<basisu::etc_block> *)(in_RDI + 0x130));
    if (uVar3 <= local_28) break;
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        vector<basisu::etc_block>::operator[]
                  ((vector<basisu::etc_block> *)in_stack_fffffffffffffe60,
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        vector<basist::selector>::operator[]
                  ((vector<basist::selector> *)in_stack_fffffffffffffe60,
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        basist::selector::get_selector
                  ((selector *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                   in_stack_fffffffffffffe68);
        etc_block::set_selector
                  ((etc_block *)in_stack_fffffffffffffe90,
                   (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffe88,
                   (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      }
    }
    local_28 = local_28 + 1;
  }
  vector<basisu::vec2U>::resize
            ((vector<basisu::vec2U> *)in_stack_fffffffffffffe70,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
  vector<basisu::etc_block>::resize
            ((vector<basisu::etc_block> *)in_stack_fffffffffffffe70,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
  vector<unsigned_int>::resize
            ((vector<unsigned_int> *)in_stack_fffffffffffffe70,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    debug_printf("init_global_codebooks: pass %u\n",(ulong)local_38);
    for (local_40 = 0; local_40 < *(uint *)(in_RDI + 0x40); local_40 = local_40 + 0x80) {
      minimum<unsigned_int>(*(uint *)(in_RDI + 0x40),local_40 + 0x80);
      std::function<void()>::function<basisu::basisu_frontend::init_global_codebooks()::__0,void>
                (in_stack_fffffffffffffe70,
                 (anon_class_24_4_1967ae0c *)
                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      job_pool::add_job(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      std::function<void_()>::~function((function<void_()> *)0x4e02e0);
    }
    job_pool::wait_for_all(in_stack_fffffffffffffea0);
    vector<basisu::vector<unsigned_int>_>::resize
              ((vector<basisu::vector<unsigned_int>_> *)in_stack_fffffffffffffe70,
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
    in_stack_fffffffffffffea0 = (job_pool *)(in_RDI + 0xc0);
    vector<basist::endpoint>::size(this_01);
    vector<basisu::vector<unsigned_int>_>::resize
              ((vector<basisu::vector<unsigned_int>_> *)in_stack_fffffffffffffe70,
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
    for (local_90 = 0; local_90 < *(uint *)(in_RDI + 0x40); local_90 = local_90 + 1) {
      vector<basisu::vec2U>::operator[]
                ((vector<basisu::vec2U> *)in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      vec2U::operator[]((vec2U *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      vector<basisu::vector<unsigned_int>_>::operator[]
                ((vector<basisu::vector<unsigned_int>_> *)in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      vector<unsigned_int>::push_back
                ((vector<unsigned_int> *)in_stack_fffffffffffffe70,
                 (uint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      vector<basisu::vector<unsigned_int>_>::operator[]
                ((vector<basisu::vector<unsigned_int>_> *)in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      vector<unsigned_int>::push_back
                ((vector<unsigned_int> *)in_stack_fffffffffffffe70,
                 (uint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    }
    vector<unsigned_int>::resize
              ((vector<unsigned_int> *)in_stack_fffffffffffffe70,
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
    for (local_a0 = 0; local_a0 < *(uint *)(in_RDI + 0x40); local_a0 = local_a0 + 0x80) {
      minimum<unsigned_int>(*(uint *)(in_RDI + 0x40),local_a0 + 0x80);
      in_stack_fffffffffffffe90 = *(job_pool **)(in_RDI + 0x38);
      std::function<void()>::function<basisu::basisu_frontend::init_global_codebooks()::__1,void>
                (in_stack_fffffffffffffe70,
                 (anon_class_16_3_3cbd76c5 *)
                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      job_pool::add_job(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      std::function<void_()>::~function((function<void_()> *)0x4e053e);
    }
    job_pool::wait_for_all(in_stack_fffffffffffffea0);
    vector<basisu::etc_block>::resize
              ((vector<basisu::etc_block> *)in_stack_fffffffffffffe70,
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
    for (uVar6 = 0; uVar6 < *(uint *)(in_RDI + 0x40); uVar6 = uVar6 + 1) {
      vector<basisu::vec2U>::operator[]
                ((vector<basisu::vec2U> *)in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      vec2U::operator[]((vec2U *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      in_stack_fffffffffffffe88 =
           (function<void_()> *)
           vector<basisu::etc_block>::operator[]
                     ((vector<basisu::etc_block> *)in_stack_fffffffffffffe60,
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                (in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      etc_block::set_block_color5_etc1s
                ((etc_block *)in_stack_fffffffffffffe60,
                 (color_rgba *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                (in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      etc_block::set_inten_tables_etc1s
                ((etc_block *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      etc_block::set_flip_bit((etc_block *)in_stack_fffffffffffffe88,true);
      this_03 = vector<basisu::etc_block>::operator[]
                          ((vector<basisu::etc_block> *)in_stack_fffffffffffffe60,
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      uVar3 = etc_block::get_raw_selector_bits(this_03);
      etc_block::set_raw_selector_bits((etc_block *)in_stack_fffffffffffffe88,uVar3);
    }
  }
  this_04 = (vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x120);
  vector<basist::selector>::size(this_02);
  vector<basisu::vector<unsigned_int>_>::resize
            (this_04,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
  local_f4 = 0;
  while( true ) {
    uVar6 = local_f4;
    uVar3 = vector<basisu::etc_block>::size((vector<basisu::etc_block> *)(in_RDI + 0x88));
    if (uVar3 <= uVar6) break;
    this_05 = (vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x120);
    vector<unsigned_int>::operator[]
              ((vector<unsigned_int> *)this_05,
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    vector<basisu::vector<unsigned_int>_>::operator[]
              (this_05,CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)this_04,(uint *)CONCAT44(uVar6,in_stack_fffffffffffffe68));
    local_f4 = local_f4 + 1;
  }
  return true;
}

Assistant:

bool basisu_frontend::init_global_codebooks()
	{
		const basist::basisu_lowlevel_etc1s_transcoder* pTranscoder = m_params.m_pGlobal_codebooks;

		const basist::basisu_lowlevel_etc1s_transcoder::endpoint_vec& endpoints = pTranscoder->get_endpoints();
		const basist::basisu_lowlevel_etc1s_transcoder::selector_vec& selectors = pTranscoder->get_selectors();
				
		m_endpoint_cluster_etc_params.resize(endpoints.size());
		for (uint32_t i = 0; i < endpoints.size(); i++)
		{
			m_endpoint_cluster_etc_params[i].m_inten_table[0] = endpoints[i].m_inten5;
			m_endpoint_cluster_etc_params[i].m_inten_table[1] = endpoints[i].m_inten5;

			m_endpoint_cluster_etc_params[i].m_color_unscaled[0].set(endpoints[i].m_color5.r, endpoints[i].m_color5.g, endpoints[i].m_color5.b, 255);
			m_endpoint_cluster_etc_params[i].m_color_used[0] = true;
			m_endpoint_cluster_etc_params[i].m_valid = true;
		}

		m_optimized_cluster_selectors.resize(selectors.size());
		for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
		{
			for (uint32_t y = 0; y < 4; y++)
				for (uint32_t x = 0; x < 4; x++)
					m_optimized_cluster_selectors[i].set_selector(x, y, selectors[i].get_selector(x, y));
		}

		m_block_endpoint_clusters_indices.resize(m_total_blocks);

		m_orig_encoded_blocks.resize(m_total_blocks);

		m_block_selector_cluster_index.resize(m_total_blocks);

#if 0
		for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
		{
			const uint32_t first_index = block_index_iter;
			const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

				for (uint32_t block_index = first_index; block_index < last_index; block_index++)
				{
					const etc_block& blk = m_etc1_blocks_etc1s[block_index];

					const uint32_t block_endpoint_index = m_block_endpoint_clusters_indices[block_index][0];

					etc_block trial_blk;
					trial_blk.set_block_color5_etc1s(blk.m_color_unscaled[0]);
					trial_blk.set_flip_bit(true);

					uint64_t best_err = UINT64_MAX;
					uint32_t best_index = 0;

					for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
					{
						trial_blk.set_raw_selector_bits(m_optimized_cluster_selectors[i].get_raw_selector_bits());

						const uint64_t cur_err = trial_blk.evaluate_etc1_error(get_source_pixel_block(block_index).get_ptr(), m_params.m_perceptual);
						if (cur_err < best_err)
						{
							best_err = cur_err;
							best_index = i;
							if (!cur_err)
								break;
						}

					} // block_index

					m_block_selector_cluster_index[block_index] = best_index;
				}

#ifndef __EMSCRIPTEN__
				});
#endif

		}

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif

		m_encoded_blocks.resize(m_total_blocks);
		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t endpoint_index = m_block_endpoint_clusters_indices[block_index][0];
			const uint32_t selector_index = m_block_selector_cluster_index[block_index];

			etc_block& blk = m_encoded_blocks[block_index];

			blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_color_unscaled[0]);
			blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_inten_table[0]);
			blk.set_flip_bit(true);
			blk.set_raw_selector_bits(m_optimized_cluster_selectors[selector_index].get_raw_selector_bits());
		}
#endif

		// HACK HACK
		const uint32_t NUM_PASSES = 3;
		for (uint32_t pass = 0; pass < NUM_PASSES; pass++)
		{
			debug_printf("init_global_codebooks: pass %u\n", pass);

			const uint32_t N = 128;
			for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index, pass] {
#endif
										
					for (uint32_t block_index = first_index; block_index < last_index; block_index++)
					{
						const etc_block& blk = pass ? m_encoded_blocks[block_index] : m_etc1_blocks_etc1s[block_index];
						const uint32_t blk_raw_selector_bits = blk.get_raw_selector_bits();

						etc_block trial_blk(blk);
						trial_blk.set_raw_selector_bits(blk_raw_selector_bits);
						trial_blk.set_flip_bit(true);

						uint64_t best_err = UINT64_MAX;
						uint32_t best_index = 0;
						etc_block best_block(trial_blk);
												
						for (uint32_t i = 0; i < m_endpoint_cluster_etc_params.size(); i++)
						{
							if (m_endpoint_cluster_etc_params[i].m_inten_table[0] > blk.get_inten_table(0))
								continue;

							trial_blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[i].m_color_unscaled[0]);
							trial_blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[i].m_inten_table[0]);

							const color_rgba* pSource_pixels = get_source_pixel_block(block_index).get_ptr();
							uint64_t cur_err;
							if (!pass)
								cur_err = trial_blk.determine_selectors(pSource_pixels, m_params.m_perceptual);
							else
								cur_err = trial_blk.evaluate_etc1_error(pSource_pixels, m_params.m_perceptual);

							if (cur_err < best_err)
							{
								best_err = cur_err;
								best_index = i;
								best_block = trial_blk;

								if (!cur_err)
									break;
							}
						}

						m_block_endpoint_clusters_indices[block_index][0] = best_index;
						m_block_endpoint_clusters_indices[block_index][1] = best_index;

						m_orig_encoded_blocks[block_index] = best_block;

					} // block_index

#ifndef __EMSCRIPTEN__
					});
#endif

			}

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			m_endpoint_clusters.resize(0);
			m_endpoint_clusters.resize(endpoints.size());
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				const uint32_t endpoint_cluster_index = m_block_endpoint_clusters_indices[block_index][0];
				m_endpoint_clusters[endpoint_cluster_index].push_back(block_index * 2);
				m_endpoint_clusters[endpoint_cluster_index].push_back(block_index * 2 + 1);
			}

			m_block_selector_cluster_index.resize(m_total_blocks);

			for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

					for (uint32_t block_index = first_index; block_index < last_index; block_index++)
					{
						const uint32_t block_endpoint_index = m_block_endpoint_clusters_indices[block_index][0];

						etc_block trial_blk;
						trial_blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[block_endpoint_index].m_color_unscaled[0]);
						trial_blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[block_endpoint_index].m_inten_table[0]);
						trial_blk.set_flip_bit(true);

						uint64_t best_err = UINT64_MAX;
						uint32_t best_index = 0;

						for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
						{
							trial_blk.set_raw_selector_bits(m_optimized_cluster_selectors[i].get_raw_selector_bits());

							const uint64_t cur_err = trial_blk.evaluate_etc1_error(get_source_pixel_block(block_index).get_ptr(), m_params.m_perceptual);
							if (cur_err < best_err)
							{
								best_err = cur_err;
								best_index = i;
								if (!cur_err)
									break;
							}

						} // block_index

						m_block_selector_cluster_index[block_index] = best_index;
					}

#ifndef __EMSCRIPTEN__
					});
#endif

			}

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			m_encoded_blocks.resize(m_total_blocks);
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				const uint32_t endpoint_index = m_block_endpoint_clusters_indices[block_index][0];
				const uint32_t selector_index = m_block_selector_cluster_index[block_index];

				etc_block& blk = m_encoded_blocks[block_index];

				blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_color_unscaled[0]);
				blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_inten_table[0]);
				blk.set_flip_bit(true);
				blk.set_raw_selector_bits(m_optimized_cluster_selectors[selector_index].get_raw_selector_bits());
			}

		} // pass

		m_selector_cluster_block_indices.resize(selectors.size());
		for (uint32_t block_index = 0; block_index < m_etc1_blocks_etc1s.size(); block_index++)
			m_selector_cluster_block_indices[m_block_selector_cluster_index[block_index]].push_back(block_index);
				
		return true;
	}